

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O2

bool QtPrivate::intersect_rect
               (QGraphicsItem *item,QRectF *exposeRect,ItemSelectionMode mode,
               QTransform *deviceTransform,void *intersectData)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  undefined1 *puVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  qreal *pqVar7;
  QTransform *pQVar8;
  QPainterPath *this;
  long in_FS_OFFSET;
  byte bVar9;
  QRectF local_188;
  QRectF local_168;
  QRectF local_148;
  QPainterPath rectPath;
  QPainterPath itemPath;
  QTransform transform;
  
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_148.xp = *intersectData;
  local_148.yp = *(qreal *)((long)intersectData + 8);
  local_148.w = *(qreal *)((long)intersectData + 0x10);
  local_148.h = *(qreal *)((long)intersectData + 0x18);
  local_168.w._0_4_ = 0xffffffff;
  local_168.w._4_4_ = 0xffffffff;
  local_168.h._0_4_ = 0xffffffff;
  local_168.h._4_4_ = 0xffffffff;
  local_168.xp._0_4_ = 0xffffffff;
  local_168.xp._4_4_ = 0xffffffff;
  local_168.yp._0_4_ = 0xffffffff;
  local_168.yp._4_4_ = 0xffffffff;
  (*item->_vptr_QGraphicsItem[3])(&local_168,item);
  _q_adjustRect(&local_168);
  pQVar2 = (item->d_ptr).d;
  if ((*(ulong *)&pQVar2->field_0x160 & 0x2000040000) == 0) {
    _itemPath = (undefined1 *)0xffffffffffffffff;
    if ((*(ulong *)&pQVar2->field_0x160 >> 0x3e & 1) == 0) {
      QTransform::mapRect((QRectF *)&itemPath);
    }
    else {
      _itemPath = (undefined1 *)
                  ((pQVar2->sceneTransform).m_matrix[2][0] +
                  (double)CONCAT44(local_168.xp._4_4_,local_168.xp._0_4_));
    }
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      bVar5 = ::operator!=(&local_148,&local_168);
      if (!bVar5) goto LAB_005b5dac;
      cVar4 = QRectF::contains((QRectF *)&local_148);
    }
    else {
      cVar4 = QRectF::intersects((QRectF *)&local_148);
    }
    if (cVar4 != '\x01' || IntersectsItemShape < mode) goto LAB_005b5df8;
    _rectPath = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&rectPath);
    QPainterPath::addRect((QRectF *)&rectPath);
    if ((*(ulong *)&pQVar2->field_0x160 & 0x4000000000000000) == 0) {
      QTransform::inverted((bool *)&transform);
      QTransform::map((QPainterPath *)&local_188);
      puVar3 = _rectPath;
      _rectPath = (undefined1 *)local_188.xp;
      local_188.xp = (qreal)puVar3;
      QPainterPath::~QPainterPath((QPainterPath *)&local_188);
    }
    else {
      QPainterPath::translate
                (-(pQVar2->sceneTransform).m_matrix[2][0],-(pQVar2->sceneTransform).m_matrix[2][1]);
    }
    this = &rectPath;
  }
  else {
    pqVar7 = (qreal *)&DAT_0067a658;
    pQVar8 = &transform;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar7;
      pqVar7 = pqVar7 + (ulong)bVar9 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    QGraphicsItem::deviceTransform(&transform,item,deviceTransform);
    local_188.w._0_4_ = 0xffffffff;
    local_188.w._4_4_ = 0xffffffff;
    local_188.h._0_4_ = 0xffffffff;
    local_188.h._4_4_ = 0xffffffff;
    local_188.xp = -NAN;
    local_188.yp._0_4_ = 0xffffffff;
    local_188.yp._4_4_ = 0xffffffff;
    QTransform::inverted((bool *)&rectPath);
    QTransform::operator*((QTransform *)&itemPath,deviceTransform);
    QTransform::mapRect((QRectF *)&local_188);
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar4 = QRectF::contains((QRectF *)&local_188);
      if (cVar4 == '\0') {
LAB_005b5dac:
        cVar4 = '\0';
        goto LAB_005b5df8;
      }
      cVar4 = ::operator!=(&local_188,&local_168);
    }
    else {
      cVar4 = QRectF::intersects((QRectF *)&local_188);
    }
    if (cVar4 != '\x01' || IntersectsItemShape < mode) goto LAB_005b5df8;
    this = &itemPath;
    _itemPath = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(this);
    QPainterPath::addRect((QRectF *)this);
  }
  cVar4 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,this,mode);
  QPainterPath::~QPainterPath(this);
LAB_005b5df8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool intersect_rect(const QGraphicsItem *item, const QRectF &exposeRect, Qt::ItemSelectionMode mode,
                               const QTransform &deviceTransform, const void *intersectData)
    {
        const QRectF sceneRect = *static_cast<const QRectF *>(intersectData);

        QRectF brect = item->boundingRect();
        _q_adjustRect(&brect);

        // ### Add test for this (without making things slower?)
        Q_UNUSED(exposeRect);

        bool keep = true;
        const QGraphicsItemPrivate *itemd = QGraphicsItemPrivate::get(item);
        if (itemd->itemIsUntransformable()) {
            // Untransformable items; map the scene rect to item coordinates.
            const QTransform transform = item->deviceTransform(deviceTransform);
            QRectF itemRect = (deviceTransform * transform.inverted()).mapRect(sceneRect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = itemRect.contains(brect) && itemRect != brect;
            else
                keep = itemRect.intersects(brect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath itemPath;
                itemPath.addRect(itemRect);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
            }
        } else {
            Q_ASSERT(!itemd->dirtySceneTransform);
            const QRectF itemSceneBoundingRect = itemd->sceneTransformTranslateOnly
                                               ? brect.translated(itemd->sceneTransform.dx(),
                                                                  itemd->sceneTransform.dy())
                                               : itemd->sceneTransform.mapRect(brect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = sceneRect != brect && sceneRect.contains(itemSceneBoundingRect);
            else
                keep = sceneRect.intersects(itemSceneBoundingRect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath rectPath;
                rectPath.addRect(sceneRect);
                if (itemd->sceneTransformTranslateOnly)
                    rectPath.translate(-itemd->sceneTransform.dx(), -itemd->sceneTransform.dy());
                else
                    rectPath = itemd->sceneTransform.inverted().map(rectPath);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, rectPath, mode);
            }
        }
        return keep;
    }